

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O2

CommandOptions * write_dolby_atmos_file(CommandOptions *Options)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  AESEncContext *this;
  HMACContext *this_00;
  CommandOptions *in_RSI;
  uint uVar10;
  undefined1 auVar11 [16];
  FortunaRNG RNG;
  SequenceParser Parser;
  MXFWriter Writer;
  Result_t local_230 [104];
  FrameBuffer FrameBuffer;
  WriterInfo Info;
  AtmosDescriptor local_f0;
  byte_t IV_buf [16];
  DCDataDescriptor local_98 [2];
  
  ASDCP::ATMOS::MXFWriter::MXFWriter(&Writer);
  ASDCP::DCData::FrameBuffer::FrameBuffer(&FrameBuffer,in_RSI->fb_size);
  local_f0.super_DCDataDescriptor.EditRate.Numerator = 0;
  local_f0.super_DCDataDescriptor.EditRate.Denominator = 0;
  ASDCP::DCData::SequenceParser::SequenceParser(&Parser);
  ASDCP::DCData::SequenceParser::OpenRead((string *)Options);
  iVar3._0_1_ = Options->error_flag;
  iVar3._1_1_ = Options->key_flag;
  iVar3._2_1_ = Options->asset_id_flag;
  iVar3._3_1_ = Options->encrypt_header_flag;
  if (-1 < iVar3) {
    ASDCP::DCData::SequenceParser::FillDCDataDescriptor(local_98);
    Kumu::Result_t::~Result_t((Result_t *)local_98);
    local_f0.super_DCDataDescriptor.EditRate = CommandOptions::PictureRate(in_RSI);
    local_f0.FirstFrame = in_RSI->ffoa;
    uVar1 = in_RSI->max_channel_count;
    uVar2 = in_RSI->max_object_count;
    auVar11._4_4_ = uVar2;
    auVar11._0_4_ = uVar1;
    auVar11._8_8_ = 0;
    auVar11 = pshuflw(auVar11,auVar11,0xe8);
    local_f0._48_4_ = auVar11._0_4_;
    Kumu::GenRandomUUID(local_f0.AtmosID);
    local_f0.AtmosVersion = '\x01';
    if (in_RSI->verbose_flag == true) {
      fwrite("Dolby ATMOS Data\n",0x11,1,_stderr);
      fputs("AtmosDescriptor:\n",_stderr);
      fprintf(_stderr,"Frame Buffer size: %u\n",(ulong)in_RSI->fb_size);
      ASDCP::ATMOS::AtmosDescriptorDump(&local_f0,(_IO_FILE *)0x0);
    }
    iVar4._0_1_ = Options->error_flag;
    iVar4._1_1_ = Options->key_flag;
    iVar4._2_1_ = Options->asset_id_flag;
    iVar4._3_1_ = Options->encrypt_header_flag;
    if (-1 < iVar4) {
      if (in_RSI->no_write_flag == false) {
        ASDCP::WriterInfo::WriterInfo(&Info,&s_MyInfo.super_WriterInfo);
        if (in_RSI->asset_id_flag == true) {
          Info.AssetUUID._0_8_ = *(undefined8 *)in_RSI->asset_id_value;
          Info.AssetUUID._8_8_ = *(undefined8 *)(in_RSI->asset_id_value + 8);
        }
        else {
          Kumu::GenRandomUUID(Info.AssetUUID);
        }
        Info.LabelSetType = LS_MXF_SMPTE;
        if (in_RSI->key_flag == true) {
          Kumu::FortunaRNG::FortunaRNG(&RNG);
          Kumu::GenRandomUUID(Info.ContextID);
          Info.EncryptedEssence = true;
          if (in_RSI->key_id_flag == true) {
            Info.CryptographicKeyID._0_8_ = *(undefined8 *)in_RSI->key_id_value;
            Info.CryptographicKeyID._8_8_ = *(undefined8 *)(in_RSI->key_id_value + 8);
          }
          else {
            create_random_uuid(Info.CryptographicKeyID);
          }
          this = (AESEncContext *)operator_new(8);
          ASDCP::AESEncContext::AESEncContext(this);
          ASDCP::AESEncContext::InitKey((uchar *)local_230);
          Kumu::Result_t::operator=((Result_t *)Options,local_230);
          Kumu::Result_t::~Result_t(local_230);
          iVar5._0_1_ = Options->error_flag;
          iVar5._1_1_ = Options->key_flag;
          iVar5._2_1_ = Options->asset_id_flag;
          iVar5._3_1_ = Options->encrypt_header_flag;
          if (-1 < iVar5) {
            Kumu::FortunaRNG::FillRandom((uchar *)&RNG,(uint)IV_buf);
            ASDCP::AESEncContext::SetIVec((uchar *)local_230);
            Kumu::Result_t::operator=((Result_t *)Options,local_230);
            Kumu::Result_t::~Result_t(local_230);
            iVar6._0_1_ = Options->error_flag;
            iVar6._1_1_ = Options->key_flag;
            iVar6._2_1_ = Options->asset_id_flag;
            iVar6._3_1_ = Options->encrypt_header_flag;
            if ((-1 < iVar6) && (in_RSI->write_hmac == true)) {
              Info.UsesHMAC = true;
              this_00 = (HMACContext *)operator_new(8);
              ASDCP::HMACContext::HMACContext(this_00);
              ASDCP::HMACContext::InitKey((uchar *)local_230,(LabelSet_t)this_00);
              Kumu::Result_t::operator=((Result_t *)Options,local_230);
              Kumu::Result_t::~Result_t(local_230);
            }
          }
          Kumu::FortunaRNG::~FortunaRNG(&RNG);
        }
        iVar7._0_1_ = Options->error_flag;
        iVar7._1_1_ = Options->key_flag;
        iVar7._2_1_ = Options->asset_id_flag;
        iVar7._3_1_ = Options->encrypt_header_flag;
        if (-1 < iVar7) {
          ASDCP::ATMOS::MXFWriter::OpenWrite
                    ((string *)local_230,(WriterInfo *)&Writer,(AtmosDescriptor *)&in_RSI->out_file,
                     (uint)&Info);
          Kumu::Result_t::operator=((Result_t *)Options,local_230);
          Kumu::Result_t::~Result_t(local_230);
        }
        ASDCP::WriterInfo::~WriterInfo(&Info);
        iVar8._0_1_ = Options->error_flag;
        iVar8._1_1_ = Options->key_flag;
        iVar8._2_1_ = Options->asset_id_flag;
        iVar8._3_1_ = Options->encrypt_header_flag;
        if (iVar8 < 0) goto LAB_0010c0aa;
      }
      ASDCP::DCData::SequenceParser::Reset();
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
      Kumu::Result_t::~Result_t((Result_t *)&Info);
      iVar9._0_1_ = Options->error_flag;
      iVar9._1_1_ = Options->key_flag;
      iVar9._2_1_ = Options->asset_id_flag;
      iVar9._3_1_ = Options->encrypt_header_flag;
      for (uVar10 = 0; (-1 < iVar9 && (uVar10 < in_RSI->duration)); uVar10 = uVar10 + 1) {
        ASDCP::DCData::SequenceParser::ReadFrame((FrameBuffer *)&Info);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
        iVar9._0_1_ = Options->error_flag;
        iVar9._1_1_ = Options->key_flag;
        iVar9._2_1_ = Options->asset_id_flag;
        iVar9._3_1_ = Options->encrypt_header_flag;
        if (-1 < iVar9) {
          if (in_RSI->verbose_flag == true) {
            ASDCP::DCData::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
          }
          if (in_RSI->encrypt_header_flag == true) {
            FrameBuffer._36_4_ = 0;
          }
          iVar9._0_1_ = Options->error_flag;
          iVar9._1_1_ = Options->key_flag;
          iVar9._2_1_ = Options->asset_id_flag;
          iVar9._3_1_ = Options->encrypt_header_flag;
          if ((-1 < iVar9) && (in_RSI->no_write_flag == false)) {
            ASDCP::ATMOS::MXFWriter::WriteFrame
                      ((FrameBuffer *)&Info,(AESEncContext *)&Writer,(HMACContext *)&FrameBuffer);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
            Kumu::Result_t::~Result_t((Result_t *)&Info);
            iVar9._0_1_ = Options->error_flag;
            iVar9._1_1_ = Options->key_flag;
            iVar9._2_1_ = Options->asset_id_flag;
            iVar9._3_1_ = Options->encrypt_header_flag;
          }
        }
      }
      if (iVar9 == Kumu::RESULT_ENDOFFILE) {
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
        iVar9._0_1_ = Options->error_flag;
        iVar9._1_1_ = Options->key_flag;
        iVar9._2_1_ = Options->asset_id_flag;
        iVar9._3_1_ = Options->encrypt_header_flag;
      }
      if ((-1 < iVar9) && (in_RSI->no_write_flag == false)) {
        ASDCP::ATMOS::MXFWriter::Finalize();
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
      }
    }
  }
LAB_0010c0aa:
  ASDCP::DCData::SequenceParser::~SequenceParser(&Parser);
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer.super_FrameBuffer);
  ASDCP::ATMOS::MXFWriter::~MXFWriter(&Writer);
  return Options;
}

Assistant:

Result_t
write_dolby_atmos_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  ATMOS::MXFWriter         Writer;
  DCData::FrameBuffer       FrameBuffer(Options.fb_size);
  ATMOS::AtmosDescriptor ADesc;
  DCData::SequenceParser    Parser;
  byte_t                  IV_buf[CBC_BLOCK_SIZE];

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
  {
    Parser.FillDCDataDescriptor(ADesc);
    ADesc.EditRate = Options.PictureRate();
    // TODO: fill AtmosDescriptor
    ADesc.FirstFrame = Options.ffoa;
    ADesc.MaxChannelCount = Options.max_channel_count;
    ADesc.MaxObjectCount = Options.max_object_count;
    Kumu::GenRandomUUID(ADesc.AtmosID);
    ADesc.AtmosVersion = 1;
    if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Dolby ATMOS Data\n");
	  fputs("AtmosDescriptor:\n", stderr);
      fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
      ATMOS::AtmosDescriptorDump(ADesc);
	}
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
  {
    WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
    if ( Options.asset_id_flag )
      memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
    else
      Kumu::GenRandomUUID(Info.AssetUUID);

    Info.LabelSetType = LS_MXF_SMPTE;

#ifdef HAVE_OPENSSL
      // configure encryption
    if( Options.key_flag )
	{
      Kumu::FortunaRNG        RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
      {
        Info.UsesHMAC = true;
        HMAC = new HMACContext;
        result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
      }
	}
#endif

    if ( ASDCP_SUCCESS(result) )
      result = Writer.OpenWrite(Options.out_file, Info, ADesc);
  }

  if ( ASDCP_SUCCESS(result) )
  {
    ui32_t duration = 0;
    result = Parser.Reset();

    while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
      result = Parser.ReadFrame(FrameBuffer);

      if ( ASDCP_SUCCESS(result) )
      {
        if ( Options.verbose_flag )
          FrameBuffer.Dump(stderr, Options.fb_dump_size);

        if ( Options.encrypt_header_flag )
          FrameBuffer.PlaintextOffset(0);
      }

      if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
      {
        result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

        // The Writer class will forward the last block of ciphertext
        // to the encryption context for use as the IV for the next
        // frame. If you want to use non-sequitur IV values, un-comment
        // the following  line of code.
        // if ( ASDCP_SUCCESS(result) && Options.key_flag )
        //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
      }
	}

    if ( result == RESULT_ENDOFFILE )
      result = RESULT_OK;
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}